

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureSpecificationTests.cpp
# Opt level: O3

void __thiscall
deqp::gles3::Functional::Texture3DSpecCase::verifyTexture
          (Texture3DSpecCase *this,GLContext *gles3Context,ReferenceContext *refContext)

{
  TestLog *log;
  deUint32 program;
  bool bVar1;
  Surface *dst;
  Texture3DSpecCase *pTVar2;
  bool bVar3;
  bool bVar4;
  DataType samplerType;
  int iVar5;
  RenderTarget *pRVar6;
  TextureFormat *pTVar7;
  long *plVar8;
  byte bVar9;
  TextureFormat TVar10;
  long *plVar11;
  int iVar12;
  ReferenceContext *pRVar13;
  void *pvVar14;
  string desc;
  string name;
  string sliceStr;
  string levelStr;
  Surface result;
  Surface reference;
  UVec4 threshold;
  Texture3DShader shader;
  int local_47c;
  undefined1 local_470 [16];
  long local_460;
  TextureFormat TStack_458;
  Texture3DSpecCase *local_448;
  long *local_440;
  long local_438;
  long local_430;
  long lStack_428;
  int local_420;
  float local_41c;
  deUint32 local_418;
  deUint32 local_414;
  int local_410;
  int local_40c;
  ReferenceContext *local_408;
  TextureFormat local_400 [2];
  long local_3f0 [2];
  long *local_3e0;
  long local_3d8;
  long local_3d0;
  long lStack_3c8;
  long *local_3c0;
  long local_3b0 [2];
  long *local_3a0;
  long local_390 [2];
  Surface local_380;
  Surface local_368;
  long *local_350;
  long *local_348;
  ContextWrapper *local_340;
  UVec4 local_338;
  undefined1 local_328 [16];
  long local_318;
  TextureFormat TStack_310;
  ios_base local_2b8 [264];
  Texture3DShader local_1b0;
  
  samplerType = glu::getSampler3DType(this->m_texFormat);
  FboTestUtil::Texture3DShader::Texture3DShader(&local_1b0,samplerType,TYPE_FLOAT_VEC4);
  local_408 = (ReferenceContext *)gles3Context;
  local_414 = (*(gles3Context->super_Context)._vptr_Context[0x75])(gles3Context,&local_1b0);
  local_418 = (*(refContext->super_Context)._vptr_Context[0x75])(refContext,&local_1b0);
  FboTestUtil::Texture3DShader::setTexScaleBias
            (&local_1b0,&(this->m_texFormatInfo).lookupScale,&(this->m_texFormatInfo).lookupBias);
  local_340 = &(this->super_TextureSpecCase).super_ContextWrapper;
  bVar3 = true;
  do {
    bVar4 = bVar3;
    pRVar13 = refContext;
    if (bVar4) {
      pRVar13 = local_408;
    }
    sglr::ContextWrapper::setContext(local_340,&pRVar13->super_Context);
    sglr::ContextWrapper::glTexParameteri(local_340,0x806f,0x2801,0x2700);
    sglr::ContextWrapper::glTexParameteri(local_340,0x806f,0x2800,0x2600);
    sglr::ContextWrapper::glTexParameteri(local_340,0x806f,0x2802,0x812f);
    sglr::ContextWrapper::glTexParameteri(local_340,0x806f,0x2803,0x812f);
    sglr::ContextWrapper::glTexParameteri(local_340,0x806f,0x8072,0x812f);
    sglr::ContextWrapper::glTexParameteri(local_340,0x806f,0x813d,this->m_numLevels + -1);
    bVar3 = false;
  } while (bVar4);
  if (0 < this->m_numLevels) {
    iVar12 = 0;
    local_448 = this;
    do {
      bVar9 = (byte)iVar12;
      local_40c = local_448->m_width >> (bVar9 & 0x1f);
      if (local_40c < 2) {
        local_40c = 1;
      }
      local_410 = local_448->m_height >> (bVar9 & 0x1f);
      if (local_410 < 2) {
        local_410 = 1;
      }
      local_420 = local_448->m_depth >> (bVar9 & 0x1f);
      iVar5 = 1;
      if (1 < local_420) {
        iVar5 = local_420;
      }
      local_41c = (float)iVar5;
      bVar3 = true;
      local_47c = 0;
      do {
        pTVar2 = local_448;
        tcu::Surface::Surface(&local_368);
        tcu::Surface::Surface(&local_380);
        FboTestUtil::Texture3DShader::setDepth(&local_1b0,((float)local_47c + 0.5) / local_41c);
        bVar4 = true;
        do {
          bVar1 = bVar4;
          program = local_418;
          dst = &local_368;
          pRVar13 = refContext;
          if (bVar1) {
            program = local_414;
            dst = &local_380;
            pRVar13 = local_408;
          }
          sglr::ContextWrapper::setContext(local_340,&pRVar13->super_Context);
          FboTestUtil::Texture3DShader::setUniforms(&local_1b0,&pRVar13->super_Context,program);
          TextureSpecCase::renderTex(&pTVar2->super_TextureSpecCase,dst,program,local_40c,local_410)
          ;
          bVar4 = false;
        } while (bVar1);
        pRVar6 = Context::getRenderTarget((pTVar2->super_TextureSpecCase).super_TestCase.m_context);
        computeCompareThreshold((Functional *)&local_338,&pRVar6->m_pixelFormat,pTVar2->m_texFormat)
        ;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_328);
        std::ostream::operator<<((ostringstream *)local_328,iVar12);
        std::__cxx11::stringbuf::str();
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_328);
        std::ios_base::~ios_base(local_2b8);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_328);
        std::ostream::operator<<((ostringstream *)local_328,local_47c);
        std::__cxx11::stringbuf::str();
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_328);
        std::ios_base::~ios_base(local_2b8);
        local_440 = &local_430;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_440,"Level","");
        pTVar7 = (TextureFormat *)
                 std::__cxx11::string::_M_append((char *)&local_440,(ulong)local_3a0);
        TVar10 = (TextureFormat)(pTVar7 + 2);
        if (*pTVar7 == TVar10) {
          local_460 = *(long *)TVar10;
          TStack_458 = pTVar7[3];
          local_470._0_8_ = &local_460;
        }
        else {
          local_460 = *(long *)TVar10;
          local_470._0_8_ = *pTVar7;
        }
        local_470._8_8_ = pTVar7[1];
        *pTVar7 = TVar10;
        pTVar7[1].order = R;
        pTVar7[1].type = SNORM_INT8;
        *(undefined1 *)&pTVar7[2].order = R;
        pTVar7 = (TextureFormat *)std::__cxx11::string::append(local_470);
        TVar10 = (TextureFormat)(pTVar7 + 2);
        if (*pTVar7 == TVar10) {
          local_318 = *(long *)TVar10;
          TStack_310 = pTVar7[3];
          local_328._0_8_ = &local_318;
        }
        else {
          local_318 = *(long *)TVar10;
          local_328._0_8_ = *pTVar7;
        }
        local_328._8_8_ = pTVar7[1];
        *pTVar7 = TVar10;
        pTVar7[1].order = R;
        pTVar7[1].type = SNORM_INT8;
        *(undefined1 *)&pTVar7[2].order = R;
        plVar8 = (long *)std::__cxx11::string::_M_append(local_328,(ulong)local_3c0);
        plVar11 = plVar8 + 2;
        if ((long *)*plVar8 == plVar11) {
          local_3d0 = *plVar11;
          lStack_3c8 = plVar8[3];
          local_3e0 = &local_3d0;
        }
        else {
          local_3d0 = *plVar11;
          local_3e0 = (long *)*plVar8;
        }
        local_3d8 = plVar8[1];
        *plVar8 = (long)plVar11;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        if ((long *)local_328._0_8_ != &local_318) {
          operator_delete((void *)local_328._0_8_,local_318 + 1);
        }
        if ((long *)local_470._0_8_ != &local_460) {
          operator_delete((void *)local_470._0_8_,local_460 + 1);
        }
        if (local_440 != &local_430) {
          operator_delete(local_440,local_430 + 1);
        }
        local_400[0] = (TextureFormat)local_3f0;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_400,"Level ","");
        pTVar7 = (TextureFormat *)
                 std::__cxx11::string::_M_append((char *)local_400,(ulong)local_3a0);
        TVar10 = (TextureFormat)(pTVar7 + 2);
        if (*pTVar7 == TVar10) {
          local_460 = *(long *)TVar10;
          TStack_458 = pTVar7[3];
          local_470._0_8_ = &local_460;
        }
        else {
          local_460 = *(long *)TVar10;
          local_470._0_8_ = *pTVar7;
        }
        local_470._8_8_ = pTVar7[1];
        *pTVar7 = TVar10;
        pTVar7[1].order = R;
        pTVar7[1].type = SNORM_INT8;
        *(undefined1 *)&pTVar7[2].order = R;
        pTVar7 = (TextureFormat *)std::__cxx11::string::append(local_470);
        TVar10 = (TextureFormat)(pTVar7 + 2);
        if (*pTVar7 == TVar10) {
          local_318 = *(long *)TVar10;
          TStack_310 = pTVar7[3];
          local_328._0_8_ = &local_318;
        }
        else {
          local_318 = *(long *)TVar10;
          local_328._0_8_ = *pTVar7;
        }
        local_328._8_8_ = pTVar7[1];
        *pTVar7 = TVar10;
        pTVar7[1].order = R;
        pTVar7[1].type = SNORM_INT8;
        *(undefined1 *)&pTVar7[2].order = R;
        plVar8 = (long *)std::__cxx11::string::_M_append(local_328,(ulong)local_3c0);
        plVar11 = plVar8 + 2;
        if ((long *)*plVar8 == plVar11) {
          local_430 = *plVar11;
          lStack_428 = plVar8[3];
          local_440 = &local_430;
        }
        else {
          local_430 = *plVar11;
          local_440 = (long *)*plVar8;
        }
        local_438 = plVar8[1];
        *plVar8 = (long)plVar11;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        if ((long *)local_328._0_8_ != &local_318) {
          operator_delete((void *)local_328._0_8_,local_318 + 1);
        }
        if ((long *)local_470._0_8_ != &local_460) {
          operator_delete((void *)local_470._0_8_,local_460 + 1);
        }
        pTVar2 = local_448;
        if (local_400[0] != (TextureFormat)local_3f0) {
          operator_delete((void *)local_400[0],local_3f0[0] + 1);
        }
        log = ((pTVar2->super_TextureSpecCase).super_TestCase.super_TestCase.super_TestNode.
              m_testCtx)->m_log;
        local_348 = local_3e0;
        local_350 = local_440;
        local_470._0_4_ = RGBA;
        local_470._4_4_ = UNORM_INT8;
        pvVar14 = (void *)local_368.m_pixels.m_cap;
        if ((void *)local_368.m_pixels.m_cap != (void *)0x0) {
          pvVar14 = local_368.m_pixels.m_ptr;
        }
        tcu::PixelBufferAccess::PixelBufferAccess
                  ((PixelBufferAccess *)local_328,(TextureFormat *)local_470,local_368.m_width,
                   local_368.m_height,1,pvVar14);
        local_400[0].order = RGBA;
        local_400[0].type = UNORM_INT8;
        pvVar14 = (void *)local_380.m_pixels.m_cap;
        if ((void *)local_380.m_pixels.m_cap != (void *)0x0) {
          pvVar14 = local_380.m_pixels.m_ptr;
        }
        tcu::PixelBufferAccess::PixelBufferAccess
                  ((PixelBufferAccess *)local_470,local_400,local_380.m_width,local_380.m_height,1,
                   pvVar14);
        bVar4 = tcu::intThresholdCompare
                          (log,(char *)local_348,(char *)local_350,
                           (ConstPixelBufferAccess *)local_328,(ConstPixelBufferAccess *)local_470,
                           &local_338,(local_47c != 0 || iVar12 != 0) + COMPARE_LOG_RESULT);
        if (!bVar4) {
          tcu::TestContext::setTestResult
                    ((local_448->super_TextureSpecCase).super_TestCase.super_TestCase.super_TestNode
                     .m_testCtx,QP_TEST_RESULT_FAIL,"Image comparison failed");
          bVar3 = false;
        }
        if (local_440 != &local_430) {
          operator_delete(local_440,local_430 + 1);
        }
        if (local_3e0 != &local_3d0) {
          operator_delete(local_3e0,local_3d0 + 1);
        }
        if (local_3c0 != local_3b0) {
          operator_delete(local_3c0,local_3b0[0] + 1);
        }
        if (local_3a0 != local_390) {
          operator_delete(local_3a0,local_390[0] + 1);
        }
        tcu::Surface::~Surface(&local_380);
        tcu::Surface::~Surface(&local_368);
        local_47c = local_47c + 1;
      } while (bVar4 && local_47c < local_420);
    } while ((bVar3) && (iVar12 = iVar12 + 1, iVar12 < local_448->m_numLevels));
  }
  sglr::ShaderProgram::~ShaderProgram(&local_1b0.super_ShaderProgram);
  return;
}

Assistant:

void Texture3DSpecCase::verifyTexture (sglr::GLContext& gles3Context, sglr::ReferenceContext& refContext)
{
	Texture3DShader shader			(glu::getSampler3DType(m_texFormat), glu::TYPE_FLOAT_VEC4);
	deUint32		shaderIDgles	= gles3Context.createProgram(&shader);
	deUint32		shaderIDRef		= refContext.createProgram(&shader);

	shader.setTexScaleBias(m_texFormatInfo.lookupScale, m_texFormatInfo.lookupBias);

	// Set state.
	for (int ndx = 0; ndx < 2; ndx++)
	{
		sglr::Context* ctx = ndx ? static_cast<sglr::Context*>(&refContext) : static_cast<sglr::Context*>(&gles3Context);

		setContext(ctx);

		glTexParameteri(GL_TEXTURE_3D, GL_TEXTURE_MIN_FILTER,	GL_NEAREST_MIPMAP_NEAREST);
		glTexParameteri(GL_TEXTURE_3D, GL_TEXTURE_MAG_FILTER,	GL_NEAREST);
		glTexParameteri(GL_TEXTURE_3D, GL_TEXTURE_WRAP_S,		GL_CLAMP_TO_EDGE);
		glTexParameteri(GL_TEXTURE_3D, GL_TEXTURE_WRAP_T,		GL_CLAMP_TO_EDGE);
		glTexParameteri(GL_TEXTURE_3D, GL_TEXTURE_WRAP_R,		GL_CLAMP_TO_EDGE);
		glTexParameteri(GL_TEXTURE_3D, GL_TEXTURE_MAX_LEVEL,	m_numLevels-1);
	}

	for (int levelNdx = 0; levelNdx < m_numLevels; levelNdx++)
	{
		int		levelW		= de::max(1, m_width	>> levelNdx);
		int		levelH		= de::max(1, m_height	>> levelNdx);
		int		levelD		= de::max(1, m_depth	>> levelNdx);
		bool	levelOk		= true;

		for (int depth = 0; depth < levelD; depth++)
		{
			tcu::Surface	reference;
			tcu::Surface	result;

			shader.setDepth(((float)depth + 0.5f) / (float)levelD);

			for (int ndx = 0; ndx < 2; ndx++)
			{
				tcu::Surface&	dst			= ndx ? reference									: result;
				sglr::Context*	ctx			= ndx ? static_cast<sglr::Context*>(&refContext)	: static_cast<sglr::Context*>(&gles3Context);
				deUint32		shaderID	= ndx ? shaderIDRef									: shaderIDgles;

				setContext(ctx);
				shader.setUniforms(*ctx, shaderID);
				renderTex(dst, shaderID, levelW, levelH);
			}

			UVec4			threshold	= computeCompareThreshold(m_context.getRenderTarget().getPixelFormat(), m_texFormat);
			string			levelStr	= de::toString(levelNdx);
			string			sliceStr	= de::toString(depth);
			string			name		= string("Level") + levelStr + "Slice" + sliceStr;
			string			desc		= string("Level ") + levelStr + ", Slice " + sliceStr;
			bool			depthOk		= tcu::intThresholdCompare(m_testCtx.getLog(), name.c_str(), desc.c_str(), reference.getAccess(), result.getAccess(), threshold,
																   (levelNdx == 0 && depth == 0) ? tcu::COMPARE_LOG_RESULT : tcu::COMPARE_LOG_ON_ERROR);

			if (!depthOk)
			{
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Image comparison failed");
				levelOk = false;
				break;
			}
		}

		if (!levelOk)
			break;
	}
}